

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O2

void GenericExceptionCatcher_Tests::
     generic_catcher_with_custom_action_which_return_fail_code_invoker(void)

{
  unit_test_log_t *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_wrap_stringstream<char> *this;
  const_string local_258;
  const_string local_248;
  const_string local_238;
  const_string local_228;
  const_string local_218;
  basic_wrap_stringstream<char> local_208;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  const_string local_30;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/generic_exception_handler_test.cpp"
  ;
  local_218.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"generic_catcher_with_custom_action_which_return_fail_code")
  ;
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_30.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_30.m_end = local_30.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_218,0x92,&local_30);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/generic_exception_handler_test.cpp"
  ;
  local_228.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"generic_catcher_with_custom_action_which_return_fail_code")
  ;
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_40.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_40.m_end = local_40.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_228,0x92,&local_40);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/generic_exception_handler_test.cpp"
  ;
  local_238.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"generic_catcher_with_custom_action_which_return_fail_code")
  ;
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_50.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_50.m_end = local_50.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_238,0x92,&local_50);
  this = &local_208;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  generic_catcher_with_custom_action_which_return_fail_code::test_method
            ((generic_catcher_with_custom_action_which_return_fail_code *)this);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/generic_exception_handler_test.cpp"
  ;
  local_248.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"generic_catcher_with_custom_action_which_return_fail_code")
  ;
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_60.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_60.m_end = local_60.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_248,0x92,&local_60);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/generic_exception_handler_test.cpp"
  ;
  local_258.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"generic_catcher_with_custom_action_which_return_fail_code")
  ;
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_70.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_70.m_end = local_70.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_258,0x92,&local_70);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_with_custom_action_which_return_fail_code)
{
   int DEFAULT_RETURN_VALUE  = 0;
   {
      int EXPECTED_RETURN_VALUE = 1;
      auto allCatcher = generic_handler<void>(DEFAULT_RETURN_VALUE, [&](){ return EXPECTED_RETURN_VALUE; });
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(EXPECTED_RETURN_VALUE, allCatcher.handleException());
         }
      }
   }
   {
      auto allCatcher = generic_handler<void>(DEFAULT_RETURN_VALUE, [&](){ return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(DEFAULT_RETURN_VALUE, allCatcher.handleException());
         }
      }
   }
   {
      int EXPECTED_RETURN_VALUE = 1;
      auto intCatcher = generic_handler<int>(DEFAULT_RETURN_VALUE, [&](int&){ return EXPECTED_RETURN_VALUE; });
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(EXPECTED_RETURN_VALUE, intCatcher.handleException());
         }
      }
   }
   {
      auto intCatcher = generic_handler<int>(DEFAULT_RETURN_VALUE, [&](int&){ return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(DEFAULT_RETURN_VALUE, intCatcher.handleException());
         }
      }
   }
   {
      auto intCatcher = generic_handler<int>(0.1, [&](int&) { return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(2.5, intCatcher.handleException());
         }
      }
   }
}